

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcStairFlightType::IfcStairFlightType(IfcStairFlightType *this)

{
  IfcStairFlightType *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x1c0,"IfcStairFlightType");
  IfcBuildingElementType::IfcBuildingElementType
            ((IfcBuildingElementType *)this,&PTR_construction_vtable_24__0105e310);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcStairFlightType,_1UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStairFlightType,_1UL>,
             &PTR_construction_vtable_24__0105e448);
  *(undefined8 *)this = 0x105e1e0;
  *(undefined8 *)&this->field_0x1c0 = 0x105e2f8;
  *(undefined8 *)&this->field_0x88 = 0x105e208;
  *(undefined8 *)&this->field_0x98 = 0x105e230;
  *(undefined8 *)&this->field_0xf0 = 0x105e258;
  *(undefined8 *)&this->field_0x148 = 0x105e280;
  *(undefined8 *)&this->field_0x180 = 0x105e2a8;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStairFlightType,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x105e2d0;
  std::__cxx11::string::string
            ((string *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStairFlightType,_1UL>).
              field_0x10);
  return;
}

Assistant:

IfcStairFlightType() : Object("IfcStairFlightType") {}